

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime.c
# Opt level: O0

mp_int * probprime_generate(PrimeGenerationContext *ctx,PrimeCandidateSource *pcs,
                           ProgressReceiver *prog)

{
  bool bVar1;
  _Bool _Var2;
  uint uVar3;
  mp_int *p_00;
  MillerRabin *mr_00;
  size_t sVar4;
  uint local_44;
  uint check;
  uint nchecks;
  _Bool known_bad;
  MillerRabin *mr;
  mp_int *p;
  ProgressReceiver *prog_local;
  PrimeCandidateSource *pcs_local;
  PrimeGenerationContext *ctx_local;
  
  pcs_ready(pcs);
  do {
    progress_report_attempt(prog);
    p_00 = pcs_generate(pcs);
    if (p_00 == (mp_int *)0x0) {
      pcs_free(pcs);
      return (mp_int *)0x0;
    }
    mr_00 = miller_rabin_new(p_00);
    bVar1 = false;
    sVar4 = mp_get_nbits(p_00);
    uVar3 = miller_rabin_checks_needed((uint)sVar4);
    for (local_44 = 0; local_44 < uVar3; local_44 = local_44 + 1) {
      _Var2 = miller_rabin_test_random(mr_00);
      if (!_Var2) {
        bVar1 = true;
        break;
      }
    }
    miller_rabin_free(mr_00);
    if (!bVar1) {
      pcs_free(pcs);
      return p_00;
    }
    mp_free(p_00);
  } while( true );
}

Assistant:

static mp_int *probprime_generate(
    PrimeGenerationContext *ctx,
    PrimeCandidateSource *pcs, ProgressReceiver *prog)
{
    pcs_ready(pcs);

    while (true) {
        progress_report_attempt(prog);

        mp_int *p = pcs_generate(pcs);
        if (!p) {
            pcs_free(pcs);
            return NULL;
        }

        MillerRabin *mr = miller_rabin_new(p);
        bool known_bad = false;
        unsigned nchecks = miller_rabin_checks_needed(mp_get_nbits(p));
        for (unsigned check = 0; check < nchecks; check++) {
            if (!miller_rabin_test_random(mr)) {
                known_bad = true;
                break;
            }
        }
        miller_rabin_free(mr);

        if (!known_bad) {
            /*
             * We have a prime!
             */
            pcs_free(pcs);
            return p;
        }

        mp_free(p);
    }
}